

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::OnTick(CGameContext *this)

{
  int iVar1;
  long lVar2;
  CPlayer *pCVar3;
  long lVar4;
  CTuneParam CVar5;
  int iVar6;
  int iVar7;
  int64 iVar8;
  int iVar9;
  long lVar10;
  int i_1;
  CTuningParams *pCVar11;
  CWorldCore *pCVar12;
  char (*pacVar13) [48];
  int i;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool Force;
  byte bVar17;
  int local_c8c;
  int local_c88;
  bool aVoteChecked [64];
  char aaBuf [64] [48];
  
  bVar17 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CheckPureTuning(this);
  pCVar11 = &this->m_Tuning;
  pCVar12 = &(this->m_World).m_Core;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    CVar5.m_Value = (pCVar11->m_GroundControlAccel).m_Value;
    (pCVar12->m_Tuning).m_GroundControlSpeed = (CTuneParam)(pCVar11->m_GroundControlSpeed).m_Value;
    (pCVar12->m_Tuning).m_GroundControlAccel = (CTuneParam)CVar5.m_Value;
    pCVar11 = (CTuningParams *)((long)pCVar11 + (ulong)bVar17 * -0x10 + 8);
    pCVar12 = (CWorldCore *)((long)pCVar12 + (ulong)bVar17 * -0x10 + 8);
  }
  CGameWorld::Tick(&this->m_World);
  (*this->m_pController->_vptr_IGameController[10])();
  for (lVar10 = 0x5e4; lVar10 != 0x624; lVar10 = lVar10 + 1) {
    pCVar3 = *(CPlayer **)((this->m_NetObjHandler).m_aMsgData + lVar10 * 8 + -0x78);
    if (pCVar3 != (CPlayer *)0x0) {
      CPlayer::Tick(pCVar3);
      CPlayer::PostTick(*(CPlayer **)((this->m_NetObjHandler).m_aMsgData + lVar10 * 8 + -0x78));
    }
  }
  if (this->m_VoteCloseTime == -1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      EndVote(this,4,false);
      return;
    }
    goto LAB_0011520f;
  }
  if (this->m_VoteCloseTime != 0) {
    iVar14 = 0;
    local_c88 = 0;
    local_c8c = 0;
    if (this->m_VoteUpdate == true) {
      pacVar13 = aaBuf;
      memset(pacVar13,0,0xc00);
      for (uVar15 = 0; uVar15 != 0x40; uVar15 = uVar15 + 1) {
        if (this->m_apPlayers[uVar15] != (CPlayer *)0x0) {
          (*(this->m_pServer->super_IInterface)._vptr_IInterface[7])
                    (this->m_pServer,uVar15 & 0xffffffff,pacVar13,0x30);
        }
        pacVar13 = pacVar13 + 1;
      }
      aVoteChecked[0x30] = false;
      aVoteChecked[0x31] = false;
      aVoteChecked[0x32] = false;
      aVoteChecked[0x33] = false;
      aVoteChecked[0x34] = false;
      aVoteChecked[0x35] = false;
      aVoteChecked[0x36] = false;
      aVoteChecked[0x37] = false;
      aVoteChecked[0x38] = false;
      aVoteChecked[0x39] = false;
      aVoteChecked[0x3a] = false;
      aVoteChecked[0x3b] = false;
      aVoteChecked[0x3c] = false;
      aVoteChecked[0x3d] = false;
      aVoteChecked[0x3e] = false;
      aVoteChecked[0x3f] = false;
      aVoteChecked[0x20] = false;
      aVoteChecked[0x21] = false;
      aVoteChecked[0x22] = false;
      aVoteChecked[0x23] = false;
      aVoteChecked[0x24] = false;
      aVoteChecked[0x25] = false;
      aVoteChecked[0x26] = false;
      aVoteChecked[0x27] = false;
      aVoteChecked[0x28] = false;
      aVoteChecked[0x29] = false;
      aVoteChecked[0x2a] = false;
      aVoteChecked[0x2b] = false;
      aVoteChecked[0x2c] = false;
      aVoteChecked[0x2d] = false;
      aVoteChecked[0x2e] = false;
      aVoteChecked[0x2f] = false;
      aVoteChecked[0x10] = false;
      aVoteChecked[0x11] = false;
      aVoteChecked[0x12] = false;
      aVoteChecked[0x13] = false;
      aVoteChecked[0x14] = false;
      aVoteChecked[0x15] = false;
      aVoteChecked[0x16] = false;
      aVoteChecked[0x17] = false;
      aVoteChecked[0x18] = false;
      aVoteChecked[0x19] = false;
      aVoteChecked[0x1a] = false;
      aVoteChecked[0x1b] = false;
      aVoteChecked[0x1c] = false;
      aVoteChecked[0x1d] = false;
      aVoteChecked[0x1e] = false;
      aVoteChecked[0x1f] = false;
      aVoteChecked[0] = false;
      aVoteChecked[1] = false;
      aVoteChecked[2] = false;
      aVoteChecked[3] = false;
      aVoteChecked[4] = false;
      aVoteChecked[5] = false;
      aVoteChecked[6] = false;
      aVoteChecked[7] = false;
      aVoteChecked[8] = false;
      aVoteChecked[9] = false;
      aVoteChecked[10] = false;
      aVoteChecked[0xb] = false;
      aVoteChecked[0xc] = false;
      aVoteChecked[0xd] = false;
      aVoteChecked[0xe] = false;
      aVoteChecked[0xf] = false;
      iVar14 = 0;
      local_c88 = 0;
      local_c8c = 0;
      for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 1) {
        pCVar3 = this->m_apPlayers[lVar10];
        if (((pCVar3 != (CPlayer *)0x0) && (pCVar3->m_Team != -1)) &&
           (aVoteChecked[lVar10] == false)) {
          lVar16 = lVar10;
          iVar7 = pCVar3->m_Vote;
          iVar1 = pCVar3->m_VotePos;
LAB_00115052:
          iVar9 = iVar1;
          iVar6 = iVar7;
          pacVar13 = aaBuf + lVar16 + 1;
          do {
            if (lVar16 == 0x3f) {
              iVar14 = iVar14 + 1;
              if (iVar6 < 1) {
                local_c8c = (local_c8c + 1) - (uint)(iVar6 == 0);
              }
              else {
                local_c88 = local_c88 + 1;
              }
              break;
            }
            if (((this->m_apPlayers[lVar16 + 1] != (CPlayer *)0x0) &&
                (aVoteChecked[lVar16 + 1] == false)) &&
               (iVar7 = str_comp(*pacVar13,aaBuf[lVar10]), iVar7 == 0)) {
              aVoteChecked[lVar16 + 1] = true;
              lVar4 = lVar16 + 1;
              iVar7 = this->m_apPlayers[lVar4]->m_Vote;
              if (iVar7 != 0) goto LAB_001150b1;
            }
            pacVar13 = pacVar13 + 1;
            lVar16 = lVar16 + 1;
          } while( true );
        }
      }
    }
    iVar7 = this->m_VoteEnforce;
    if (iVar7 == 1) {
LAB_0011511b:
      (*(this->m_pServer->super_IInterface)._vptr_IInterface[0x12])
                (this->m_pServer,0xfffffffffffffffe);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pConsole,this->m_aVoteCommand);
      (*(this->m_pServer->super_IInterface)._vptr_IInterface[0x12])
                (this->m_pServer,0xffffffffffffffff);
      if (((long)this->m_VoteCreator != -1) &&
         (this->m_apPlayers[this->m_VoteCreator] != (CPlayer *)0x0)) {
        this->m_apPlayers[this->m_VoteCreator]->m_LastVoteCallTick = 0;
      }
      Force = this->m_VoteEnforce == 1;
      iVar14 = 5;
    }
    else {
      if ((this->m_VoteUpdate == true) && (iVar14 / 2 < local_c88)) goto LAB_0011511b;
      if (iVar7 == -1) {
        iVar7 = -1;
      }
      else if ((this->m_VoteUpdate == false) || (local_c8c < (iVar14 + 1) / 2)) {
        iVar8 = time_get();
        if (iVar8 <= this->m_VoteCloseTime) {
          if (this->m_VoteUpdate == true) {
            this->m_VoteUpdate = false;
            SendVoteStatus(this,-1,iVar14,local_c88,local_c8c);
          }
          goto LAB_001151c3;
        }
        iVar7 = this->m_VoteEnforce;
      }
      Force = iVar7 == -1;
      iVar14 = 6;
    }
    EndVote(this,iVar14,Force);
  }
LAB_001151c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_0011520f:
  __stack_chk_fail();
LAB_001150b1:
  lVar16 = lVar16 + 1;
  iVar1 = this->m_apPlayers[lVar4]->m_VotePos;
  if (iVar6 != 0) {
    if (iVar9 <= iVar1) {
      iVar7 = iVar6;
    }
    if (iVar9 < iVar1) {
      iVar1 = iVar9;
    }
  }
  goto LAB_00115052;
}

Assistant:

void CGameContext::OnTick()
{
	// check tuning
	CheckPureTuning();

	// copy tuning
	m_World.m_Core.m_Tuning = m_Tuning;
	m_World.Tick();

	//if(world.paused) // make sure that the game object always updates
	m_pController->Tick();

	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(m_apPlayers[i])
		{
			m_apPlayers[i]->Tick();
			m_apPlayers[i]->PostTick();
		}
	}

	// update voting
	if(m_VoteCloseTime)
	{
		// abort the kick-vote on player-leave
		if(m_VoteCloseTime == -1)
			EndVote(VOTE_END_ABORT, false);
		else
		{
			int Total = 0, Yes = 0, No = 0;
			if(m_VoteUpdate)
			{
				// count votes
				char aaBuf[MAX_CLIENTS][NETADDR_MAXSTRSIZE] = {{0}};
				for(int i = 0; i < MAX_CLIENTS; i++)
					if(m_apPlayers[i])
						Server()->GetClientAddr(i, aaBuf[i], NETADDR_MAXSTRSIZE);
				bool aVoteChecked[MAX_CLIENTS] = {0};
				for(int i = 0; i < MAX_CLIENTS; i++)
				{
					if(!m_apPlayers[i] || m_apPlayers[i]->GetTeam() == TEAM_SPECTATORS || aVoteChecked[i])	// don't count in votes by spectators
						continue;

					int ActVote = m_apPlayers[i]->m_Vote;
					int ActVotePos = m_apPlayers[i]->m_VotePos;

					// check for more players with the same ip (only use the vote of the one who voted first)
					for(int j = i+1; j < MAX_CLIENTS; ++j)
					{
						if(!m_apPlayers[j] || aVoteChecked[j] || str_comp(aaBuf[j], aaBuf[i]))
							continue;

						aVoteChecked[j] = true;
						if(m_apPlayers[j]->m_Vote && (!ActVote || ActVotePos > m_apPlayers[j]->m_VotePos))
						{
							ActVote = m_apPlayers[j]->m_Vote;
							ActVotePos = m_apPlayers[j]->m_VotePos;
						}
					}

					Total++;
					if(ActVote > 0)
						Yes++;
					else if(ActVote < 0)
						No++;
				}
			}

			if(m_VoteEnforce == VOTE_CHOICE_YES || (m_VoteUpdate && Yes >= Total/2+1))
			{
				Server()->SetRconCID(IServer::RCON_CID_VOTE);
				Console()->ExecuteLine(m_aVoteCommand);
				Server()->SetRconCID(IServer::RCON_CID_SERV);
				if(m_VoteCreator != -1 && m_apPlayers[m_VoteCreator])
					m_apPlayers[m_VoteCreator]->m_LastVoteCallTick = 0;

				EndVote(VOTE_END_PASS, m_VoteEnforce == VOTE_CHOICE_YES);
			}
			else if(m_VoteEnforce == VOTE_CHOICE_NO || (m_VoteUpdate && No >= (Total+1)/2) || time_get() > m_VoteCloseTime)
				EndVote(VOTE_END_FAIL, m_VoteEnforce == VOTE_CHOICE_NO);
			else if(m_VoteUpdate)
			{
				m_VoteUpdate = false;
				SendVoteStatus(-1, Total, Yes, No);
			}
		}
	}


#ifdef CONF_DEBUG
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(m_apPlayers[i] && m_apPlayers[i]->IsDummy())
		{
			CNetObj_PlayerInput Input = {0};
			Input.m_Direction = (i&1)?-1:1;
			m_apPlayers[i]->OnPredictedInput(&Input);
		}
	}
#endif
}